

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_iterator.hpp
# Opt level: O2

void __thiscall
burst::
intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_*,_std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>_>,_std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_>_>_>,_std::less<void>_>
::intersect_iterator
          (intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_*,_std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>_>,_std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_>_>_>,_std::less<void>_>
           *this,__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_*,_std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>_>,_std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_>_>_>
                 first,
          __normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_*,_std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>_>,_std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_>_>_>
          last)

{
  bool bVar1;
  undefined8 unaff_RBX;
  
  (this->m_begin)._M_current = (iterator_range<boost::range_detail::integer_iterator<int>_> *)0x0;
  (this->m_end)._M_current = (iterator_range<boost::range_detail::integer_iterator<int>_> *)0x0;
  bVar1 = std::
          none_of<__gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>>*,std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>>,std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>>>>>,burst::intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>>*,std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>>,std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>>>>>,std::less<void>>::intersect_iterator(__gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>>*,std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>>,std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>>>>>,__gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>>*,std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>>,std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>>>>>,std::less<void>)::_lambda(auto:1_const&)_1_>
                    (first._M_current,last._M_current);
  if (bVar1) {
    (this->m_begin)._M_current = first._M_current;
    (this->m_end)._M_current = last._M_current;
    std::
    __sort<__gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>>*,std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>>,std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<burst::compose_fn<burst::apply_fn<std::less<void>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>>
              (first,last,
               (_Iter_comp_iter<burst::compose_fn<burst::apply_fn<std::less<void>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>_>
                )SUB83(unaff_RBX,0));
    settle(this);
    return;
  }
  return;
}

Assistant:

explicit intersect_iterator
            (
                outer_range_iterator first, outer_range_iterator last,
                Compare compare = Compare()
            ):
            m_begin{},
            m_end{},
            m_compare(compare)
        {
            if (std::none_of(first, last, [] (const auto & range) {return range.empty();}))
            {
                BOOST_ASSERT((std::all_of(first, last,
                    [this] (const auto & range)
                    {
                        return boost::algorithm::is_sorted(range, m_compare);
                    })));

                m_begin = std::move(first);
                m_end = std::move(last);
                std::sort(m_begin, m_end, each(front) | m_compare);
                settle();
            }
        }